

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor
          (AudioChannelLabelSubDescriptor *this,AudioChannelLabelSubDescriptor *rhs)

{
  byte_t *value;
  UL local_48;
  AudioChannelLabelSubDescriptor *local_18;
  AudioChannelLabelSubDescriptor *rhs_local;
  AudioChannelLabelSubDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  MCALabelSubDescriptor::MCALabelSubDescriptor
            (&this->super_MCALabelSubDescriptor,
             (rhs->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict);
  (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__AudioChannelLabelSubDescriptor_0033b470;
  optional_property<Kumu::UUID>::optional_property(&this->SoundfieldGroupLinkID);
  if ((this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict,
                           MDD_AudioChannelLabelSubDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    (*(this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
      [0x14])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xf5a,
                "ASDCP::MXF::AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(const AudioChannelLabelSubDescriptor &)"
               );
}

Assistant:

AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor(const AudioChannelLabelSubDescriptor& rhs) : MCALabelSubDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_AudioChannelLabelSubDescriptor);
  Copy(rhs);
}